

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O3

HelicsApp helicsCreateApp(char *appName,char *appType,char *configFile,HelicsFederateInfo fedInfo,
                         HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  App *this;
  ConfigType CVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  FederateInfo *pFVar6;
  _Alloc_hider fedInfo_00;
  AppObject *pAVar7;
  string_view appName_00;
  string_view appName_01;
  string_view configString;
  string_view type;
  string_view type_00;
  FederateInfo newFedInfo;
  AppObject *local_220;
  _Head_base<0UL,_helics::AppObject_*,_false> local_218;
  string local_210;
  size_t local_1f0;
  element_type *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  FederateInfo local_1d8;
  
  if ((err != (HelicsError *)0x0) && (err->error_code != 0)) {
    return (HelicsApp)0x0;
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  if (configFile == (char *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
               gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
               gHelicsEmptyStr_abi_cxx11_._M_string_length);
  }
  else {
    sVar3 = strlen(configFile);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,configFile,configFile + sVar3);
  }
  local_220 = (AppObject *)operator_new(0x38);
  (local_220->type).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(local_220->type).field_2 + 8) = 0;
  (local_220->type)._M_dataplus._M_p = (pointer)&(local_220->type).field_2;
  (local_220->type)._M_string_length = 0;
  (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_220->index = -2;
  local_220->valid = 0x7a8f1c4d;
  pcVar4 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
  fedInfo_00 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  if (appName != (char *)0x0) {
    pcVar4 = (char *)strlen(appName);
    fedInfo_00._M_p = appName;
  }
  if (appType == (char *)0x0) {
LAB_001b25ec:
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = 
      "app type must be one of \'connector\', \'source\',\'recorder\',\'player\',\'echo\',\'clone\',\'probe\',\'tracer\'"
      ;
    }
LAB_001b2602:
    pAVar7 = (AppObject *)0x0;
  }
  else {
    pcVar5 = (char *)strlen(appType);
    local_1f0 = local_210._M_string_length;
    if ((fedInfo == (HelicsFederateInfo)0x0) &&
       (configString._M_str = local_210._M_dataplus._M_p,
       configString._M_len = local_210._M_string_length,
       CVar2 = helics::fileops::getConfigType(configString), CVar2 != NONE)) {
      helics::loadFederateInfo(&local_1d8,&local_210);
      appName_01._M_str = pcVar4;
      appName_01._M_len = (size_t)appType;
      type_00._M_str = pcVar5;
      type_00._M_len = (size_t)&local_1e8;
      anon_unknown.dwarf_110546::buildApp(type_00,appName_01,(FederateInfo *)fedInfo_00._M_p);
      p_Var1 = (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1e8;
      (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = p_Stack_1e0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      helics::FederateInfo::~FederateInfo(&local_1d8);
      if ((local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) goto LAB_001b25ec;
    }
    else {
      pFVar6 = getFedInfo(fedInfo,err);
      if (pFVar6 == (FederateInfo *)0x0) goto LAB_001b2602;
      appName_00._M_str = pcVar4;
      appName_00._M_len = (size_t)appType;
      type._M_str = pcVar5;
      type._M_len = (size_t)&local_1d8;
      anon_unknown.dwarf_110546::buildApp(type,appName_00,(FederateInfo *)fedInfo_00._M_p);
      p_Var1 = (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_1d8.super_CoreFederateInfo.timeProps.
           super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1d8.super_CoreFederateInfo.timeProps.
               super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      this = (local_220->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      if (this == (App *)0x0) goto LAB_001b25ec;
      if ((local_1f0 != 0) && (local_210._M_string_length != 0)) {
        helics::apps::App::loadFile(this,&local_210,true);
      }
    }
    pAVar7 = local_220;
    getMasterHolder();
    local_218._M_head_impl = local_220;
    local_220 = (AppObject *)0x0;
    MasterObjectHolder::addApp
              ((MasterObjectHolder *)
               local_1d8.super_CoreFederateInfo.timeProps.
               super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)&local_218)
    ;
    if (local_218._M_head_impl != (AppObject *)0x0) {
      std::default_delete<helics::AppObject>::operator()
                ((default_delete<helics::AppObject> *)&local_218,local_218._M_head_impl);
    }
    local_218._M_head_impl = (AppObject *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1d8.super_CoreFederateInfo.timeProps.
        super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1d8.super_CoreFederateInfo.timeProps.
                 super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (local_220 != (AppObject *)0x0) {
    std::default_delete<helics::AppObject>::operator()
              ((default_delete<helics::AppObject> *)&local_220,local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  return pAVar7;
}

Assistant:

HelicsApp helicsCreateApp(const char* appName, const char* appType, const char* configFile, HelicsFederateInfo fedInfo, HelicsError* err)
{
    static constexpr const char* invalidAppTypeString =
        "app type must be one of 'connector', 'source','recorder','player','echo','clone','probe','tracer'";
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    try {
        auto cstring = AS_STRING(configFile);
        auto app = std::make_unique<helics::AppObject>();
        app->valid = helics::appValidationIdentifier;
        auto nstring = AS_STRING_VIEW(appName);
        if (appType == nullptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAppTypeString);
            return nullptr;
        }

        const std::string_view appTypeName(appType);
        bool loadFile = !cstring.empty();
        if (fedInfo == nullptr && helics::fileops::getConfigType(cstring) != helics::fileops::ConfigType::NONE) {
            helics::FederateInfo newFedInfo = helics::loadFederateInfo(cstring);
            app->app = buildApp(appTypeName, nstring, newFedInfo);
            loadFile = false;
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            app->app = buildApp(appTypeName, nstring, *info);
        }

        if (!app->app) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAppTypeString);
            return nullptr;
        }
        if (loadFile && !cstring.empty()) {
            app->app->loadFile(cstring);
        }
        auto* retapp = reinterpret_cast<HelicsApp>(app.get());
        getMasterHolder()->addApp(std::move(app));
        return retapp;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}